

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O1

ulong __thiscall
nuraft::raft_server::store_log_entry(raft_server *this,ptr<log_entry> *entry,ulong index)

{
  element_type *peVar1;
  element_type *peVar2;
  long *plVar3;
  int iVar4;
  undefined4 extraout_var;
  string local_40;
  
  peVar1 = (this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (index == 0) {
    iVar4 = (*peVar1->_vptr_log_store[5])(peVar1,entry);
    index = CONCAT44(extraout_var,iVar4);
  }
  else {
    (*peVar1->_vptr_log_store[6])(peVar1,index,entry);
  }
  if (((entry->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      value_type_ == conf) {
    iVar4 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[0x10])();
    if ((char)iVar4 == '\0') {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar4 = (*peVar2->_vptr_logger[7])();
        if (0 < iVar4) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_(&local_40,"log store flush failed");
          (*peVar2->_vptr_logger[8])
                    (peVar2,1,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"store_log_entry",0x68a,&local_40);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != &local_40.field_2) {
            operator_delete(local_40._M_dataplus._M_p);
          }
        }
      }
      plVar3 = *(long **)&(((this->ctx_)._M_t.
                            super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                            .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                          state_mgr_).
                          super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
      (**(code **)(*plVar3 + 0x40))(plVar3,0xffffffeb);
    }
    if ((this->role_)._M_i == leader) {
      try_update_precommit_index(this,index,10);
    }
  }
  return index;
}

Assistant:

ulong raft_server::store_log_entry(ptr<log_entry>& entry, ulong index) {
    ulong log_index = index;
    if (index == 0) {
        log_index = log_store_->append(entry);
    } else {
        log_store_->write_at(log_index, entry);
    }

    if ( entry->get_val_type() == log_val_type::conf ) {
        // Force persistence of config_change logs to guarantee the durability of
        // cluster membership change log entries.  Losing cluster membership log
        // entries may lead to split brain.
        if ( !log_store_->flush() ) {
            // LCOV_EXCL_START
            p_ft("log store flush failed");
            ctx_->state_mgr_->system_exit(N21_log_flush_failed);
            // LCOV_EXCL_STOP
        }

        if ( role_ == srv_role::leader ) {
            // Need to progress precommit index for config.
            try_update_precommit_index(log_index);
        }
    }

    return log_index;
}